

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-pool.c
# Opt level: O3

MMDB_entry_data_list_s * data_pool_to_list(MMDB_data_pool_s *pool)

{
  ulong uVar1;
  MMDB_entry_data_list_s *pMVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  size_t *psVar7;
  ulong uVar8;
  MMDB_entry_data_list_s *pMVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  long lVar12;
  
  auVar5 = _DAT_00106ac0;
  auVar4 = _DAT_00106ab0;
  if ((pool != (MMDB_data_pool_s *)0x0) && ((uVar1 = pool->index, uVar1 != 0 || (pool->used != 0))))
  {
    uVar6 = 0;
    do {
      pMVar2 = pool->blocks[uVar6];
      psVar7 = pool->sizes + uVar6;
      if (uVar6 == uVar1) {
        psVar7 = &pool->used;
      }
      uVar3 = *psVar7;
      if (uVar3 != 1) {
        uVar8 = uVar3 & 0xfffffffffffffffe;
        lVar12 = uVar3 - 2;
        auVar10._8_4_ = (int)lVar12;
        auVar10._0_8_ = lVar12;
        auVar10._12_4_ = (int)((ulong)lVar12 >> 0x20);
        pMVar9 = pMVar2 + 1;
        auVar10 = auVar10 ^ auVar5;
        auVar11 = auVar4;
        do {
          auVar13 = auVar11 ^ auVar5;
          if ((bool)(~(auVar10._4_4_ < auVar13._4_4_ ||
                      auVar10._0_4_ < auVar13._0_4_ && auVar13._4_4_ == auVar10._4_4_) & 1)) {
            pMVar9[-1].next = pMVar9;
          }
          if (auVar13._12_4_ <= auVar10._12_4_ &&
              (auVar13._8_4_ <= auVar10._8_4_ || auVar13._12_4_ != auVar10._12_4_)) {
            pMVar9->next = pMVar9 + 1;
          }
          lVar12 = auVar11._8_8_;
          auVar11._0_8_ = auVar11._0_8_ + 2;
          auVar11._8_8_ = lVar12 + 2;
          pMVar9 = pMVar9 + 2;
          uVar8 = uVar8 - 2;
        } while (uVar8 != 0);
      }
      if (uVar6 < uVar1) {
        pMVar2[uVar3 - 1].next = pool->blocks[uVar6 + 1];
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 <= uVar1);
    return pool->blocks[0];
  }
  return (MMDB_entry_data_list_s *)0x0;
}

Assistant:

MMDB_entry_data_list_s *data_pool_to_list(MMDB_data_pool_s *const pool) {
    if (!pool) {
        return NULL;
    }

    if (pool->index == 0 && pool->used == 0) {
        return NULL;
    }

    for (size_t i = 0; i <= pool->index; i++) {
        MMDB_entry_data_list_s *const block = pool->blocks[i];

        size_t size = pool->sizes[i];
        if (i == pool->index) {
            size = pool->used;
        }

        for (size_t j = 0; j < size - 1; j++) {
            MMDB_entry_data_list_s *const cur = block + j;
            cur->next = block + j + 1;
        }

        if (i < pool->index) {
            MMDB_entry_data_list_s *const last = block + size - 1;
            last->next = pool->blocks[i + 1];
        }
    }

    return pool->blocks[0];
}